

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial2.cpp
# Opt level: O0

void CovarianceTexture(int x,int y)

{
  double dVar1;
  double dVar2;
  array<double,_10UL> matrix;
  undefined1 auVar3 [48];
  bool bVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  void *pvVar8;
  double dv;
  double du;
  double bf;
  Vector dU;
  Vector dx;
  Vector hitp;
  int id;
  double t_1;
  Ray ray;
  Vector d;
  int i;
  int x_1;
  int y_1;
  Vector Dy;
  Vector Dx;
  double sxy;
  double syy;
  double sxx;
  PosCov surfCov;
  Cov4D pixelCov;
  Vector t;
  undefined1 *w;
  ostream *out;
  Vector *in_stack_fffffffffffffa58;
  Vector *w_00;
  Vector *in_stack_fffffffffffffa60;
  Vector *w_01;
  Ray *r;
  vector<Sphere,_std::allocator<Sphere>_> *spheres;
  allocator<char> *__a;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined8 in_stack_fffffffffffffa98;
  undefined8 in_stack_fffffffffffffaa0;
  double dVar9;
  double in_stack_fffffffffffffaa8;
  Cov4D *in_stack_fffffffffffffac8;
  double dVar10;
  Covariance4D<Vector,_double> *in_stack_fffffffffffffad0;
  double *in_stack_fffffffffffffae8;
  double *in_stack_fffffffffffffaf0;
  double *in_stack_fffffffffffffaf8;
  Covariance4D<Vector,_double> *in_stack_fffffffffffffb00;
  Vector *in_stack_fffffffffffffb60;
  Vector *in_stack_fffffffffffffb68;
  Covariance4D<Vector,_double> *in_stack_fffffffffffffb70;
  Vector local_3f0;
  Vector local_3d8 [3];
  Ray local_380 [3];
  int in_stack_fffffffffffffd18;
  int in_stack_fffffffffffffd1c;
  Cov4D *in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  undefined4 in_stack_fffffffffffffd30;
  int iVar11;
  undefined4 in_stack_fffffffffffffd34;
  int iVar12;
  stringstream *in_stack_fffffffffffffd40;
  Vector local_2b0;
  double local_298;
  double local_290;
  double local_288;
  Ray local_280 [3];
  Vector VStack_1e8;
  Vector VStack_1d0;
  Vector VStack_1b8;
  allocator<char> local_189;
  string local_188 [32];
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  Vector local_20;
  
  operator*(in_stack_fffffffffffffa60,(double)in_stack_fffffffffffffa58);
  operator*(in_stack_fffffffffffffa60,(double)in_stack_fffffffffffffa58);
  operator+(in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
  operator+(in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
  Vector::Normalize(in_stack_fffffffffffffa60);
  local_128 = 0;
  uStack_120 = 0x40f86a0000000000;
  local_138 = 0;
  uStack_130 = 0;
  local_148 = 0;
  uStack_140 = 0x40f86a0000000000;
  local_158 = 0x40f86a0000000000;
  uStack_150 = 0;
  local_168 = 0x40f86a0000000000;
  uStack_160 = 0;
  __s = (char *)0x0;
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x40f86a0000000000;
  __a = (allocator<char> *)0x0;
  r = (Ray *)0x0;
  spheres = (vector<Sphere,_std::allocator<Sphere>_> *)0x40f86a0000000000;
  w_00 = (Vector *)0x40f86a0000000000;
  w_01 = (Vector *)0x0;
  out = (ostream *)0x0;
  auVar3 = ZEXT2448(CONCAT816(0x40f86a0000000000,ZEXT816(0)));
  matrix._M_elems[6] = 100000.0;
  matrix._M_elems[0] = (double)auVar3._0_8_;
  matrix._M_elems[1] = (double)auVar3._8_8_;
  matrix._M_elems[2] = (double)auVar3._16_8_;
  matrix._M_elems[3] = (double)auVar3._24_8_;
  matrix._M_elems[4] = (double)auVar3._32_8_;
  matrix._M_elems[5] = (double)auVar3._40_8_;
  matrix._M_elems[7] = (double)in_stack_fffffffffffffa98;
  matrix._M_elems[8] = (double)in_stack_fffffffffffffaa0;
  matrix._M_elems[9] = in_stack_fffffffffffffaa8;
  Covariance::Covariance4D<Vector,_double>::Covariance4D
            ((Covariance4D<Vector,_double> *)0x0,matrix,(Vector *)0x40f86a0000000000);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,__s,__a);
  std::__cxx11::stringstream::str((string *)sout_abi_cxx11_);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator(&local_189);
  Ray::Ray(local_280,&cam.o,&local_20);
  w = sout_abi_cxx11_;
  CovarianceFilter((vector<Sphere,_std::allocator<Sphere>_> *)
                   CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                   (Ray *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                   in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18,
                   in_stack_fffffffffffffd40);
  poVar7 = operator<<((ostream *)in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  poVar7 = std::operator<<((ostream *)(sout_abi_cxx11_ + 0x10),"Volume = ");
  dVar9 = Covariance::Covariance4D<Vector,_double>::Volume(in_stack_fffffffffffffad0);
  pvVar8 = (void *)std::ostream::operator<<(poVar7,dVar9);
  std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(sout_abi_cxx11_ + 0x10,std::endl<char,std::char_traits<char>>);
  local_288 = 0.0;
  local_290 = 0.0;
  local_298 = 0.0;
  Vector::Vector(&local_2b0,0.0,0.0,0.0);
  Vector::Vector((Vector *)&stack0xfffffffffffffd38,0.0,0.0,0.0);
  Covariance::Covariance4D<Vector,_double>::SpatialFilter
            (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,
             in_stack_fffffffffffffae8);
  Covariance::Covariance4D<Vector,_double>::SpatialExtent
            (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
  poVar7 = std::operator<<((ostream *)(sout_abi_cxx11_ + 0x10),"Spatial filter = [");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_288);
  poVar7 = std::operator<<(poVar7,",");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_298);
  poVar7 = std::operator<<(poVar7,"; ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_298);
  poVar7 = std::operator<<(poVar7,", ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_290);
  poVar7 = std::operator<<(poVar7,"]");
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)(sout_abi_cxx11_ + 0x10),"Extent = ");
  poVar7 = operator<<(out,(Vector *)w);
  std::operator<<(poVar7,", ");
  poVar7 = operator<<(out,(Vector *)w);
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  poVar7 = std::operator<<((ostream *)(sout_abi_cxx11_ + 0x10),"|Dx| = ");
  dVar9 = Vector::Norm((Vector *)0x135575);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,dVar9);
  poVar7 = std::operator<<(poVar7,", |Dy| = ");
  dVar9 = Vector::Norm((Vector *)0x1355cb);
  pvVar8 = (void *)std::ostream::operator<<(poVar7,dVar9);
  std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
  iVar12 = 0;
  do {
    if (height <= iVar12) {
      return;
    }
    for (iVar11 = 0; iVar11 < width; iVar11 = iVar11 + 1) {
      iVar5 = ((width - iVar11) + -1) * height + iVar12;
      operator*(w_01,(double)w_00);
      operator*(w_01,(double)w_00);
      operator+(w_01,w_00);
      operator+(w_01,w_00);
      Vector::Normalize(w_01);
      Ray::Ray(local_380,&cam.o,(Vector *)&stack0xfffffffffffffd10);
      bVar4 = Intersect(spheres,r,&w_01->x,(int *)w_00);
      if (bVar4) {
        operator*((double)w_01,w_00);
        operator+(w_01,w_00);
        operator-(w_01,w_00);
        dVar9 = Vector::Dot(local_3d8,&VStack_1e8);
        dVar1 = Vector::Dot(local_3d8,&VStack_1d0);
        dVar10 = Vector::Dot(local_3d8,&VStack_1b8);
        Vector::Vector(&local_3f0,dVar9,dVar1,dVar10);
        if ((useCovFilter & 1U) == 0) {
          dVar9 = Vector::Dot(&local_3f0,&local_2b0);
          dVar1 = Vector::Norm((Vector *)0x135a96);
          dVar10 = Vector::Dot(&local_3f0,(Vector *)&stack0xfffffffffffffd38);
          dVar2 = Vector::Norm((Vector *)0x135ad4);
          iVar6 = (int)(dVar9 / dVar1);
          if (iVar6 < 1) {
            iVar6 = -iVar6;
          }
          dVar9 = Vector::Norm((Vector *)0x135b11);
          if (dVar9 <= (double)iVar6) {
LAB_00135b77:
            dVar9 = 0.0;
          }
          else {
            iVar6 = (int)(dVar10 / dVar2);
            if (iVar6 < 1) {
              iVar6 = -iVar6;
            }
            dVar9 = (double)iVar6;
            dVar1 = Vector::Norm((Vector *)0x135b44);
            if (dVar1 <= dVar9) goto LAB_00135b77;
            dVar9 = exp(local_3f0.z * -10.0 * local_3f0.z);
          }
          cov_img[iVar5] = (float)dVar9;
        }
        else {
          dVar9 = local_3f0.y * local_3f0.y * local_290;
          dVar2 = local_3f0.x * local_3f0.x * local_288;
          dVar1 = local_3f0.x * 2.0 * local_3f0.y * local_298;
          dVar10 = exp(local_3f0.z * -10.0 * local_3f0.z);
          dVar9 = exp((dVar1 + dVar2 + dVar9) * -0.5);
          cov_img[iVar5] = (float)(dVar10 * dVar9);
        }
      }
    }
    iVar12 = iVar12 + 1;
  } while( true );
}

Assistant:

void CovarianceTexture(int x, int y) {
   // Generate a covariance matrix at the sampling position
   const auto t = (cx*((x+0.5)/double(width) - .5) + cy*((y+0.5)/double(height) - .5) + cam.d).Normalize();
   //*/
   const auto pixelCov = Cov4D({ 1.0E+5, 0.0, 1.0E+5, 0.0, 0.0, 1.0E+5, 0.0, 0.0, 0.0, 1.0E+5 }, t);
   /*/
   const auto pixelCov = Cov4D({ 1.0E-5, 0.0, 1.0E-5, 0.0, 0.0, 1.0E-5, 0.0, 0.0, 0.0, 1.0E-5 }, t);
   //*/
   sout.str("");
   const auto surfCov  = CovarianceFilter(spheres, Ray(cam.o, t), pixelCov, 0, 1, sout);
   sout << surfCov.second << std::endl;
   sout << "Volume = " << surfCov.second.Volume() << std::endl;
   sout << std::endl;

   double sxx = 0, syy = 0, sxy = 0;
   Vector Dx, Dy;
   try {
      surfCov.second.SpatialFilter(sxx, sxy, syy);
      surfCov.second.SpatialExtent(Dx, Dy);
      sout << "Spatial filter = [" << sxx << "," << sxy << "; " << sxy << ", " << syy << "]"<< std::endl;
      sout << "Extent = " << Dx << ", " << Dy << std::endl;
      sout << "|Dx| = " << Vector::Norm(Dx) << ", |Dy| = " << Vector::Norm(Dy) << std::endl;
   } catch (...) {
      std::cout << "Error: incorrect spatial filter" << std::endl;
      sout << surfCov.second << std::endl;
      return;
   }

   // Loop over the rows and columns of the image and evaluate radiance and
   // covariance per pixel using Monte-Carlo.
   #pragma omp parallel for schedule(dynamic, 1)
   for (int y=0; y<height; y++){
      for (int x=0; x<width; x++) {
         // Pixel index
         int i=(width-x-1)*height+y;

         // Generate the pixel direction
         Vector d = cx*( ( 0.5 + x)/width - .5) +
                    cy*( ( 0.5 + y)/height - .5) + cam.d;
         d.Normalize();

         Ray ray(cam.o, d);
         double t; int id;
         if(!Intersect(spheres, ray, t, id)){ continue; }
         Vector hitp = ray.o + t*ray.d;

         // Evaluate the covariance
         const Vector dx  = surfCov.first - hitp;
         const Vector dU = Vector(Vector::Dot(dx, surfCov.second.x), Vector::Dot(dx, surfCov.second.y), Vector::Dot(dx, surfCov.second.z));
         if(useCovFilter) {
            double bf = dU.x*dU.x*sxx + dU.y*dU.y*syy + 2*dU.x*dU.y*sxy;
            cov_img[i] = exp(-10.0*dU.z*dU.z) * exp(- 0.5* bf);
         } else {

            const double du  = Vector::Dot(dU, Dx) / Vector::Norm(Dx);
            const double dv  = Vector::Dot(dU, Dy) / Vector::Norm(Dy);
            cov_img[i] = (abs(du) < Vector::Norm(Dx) &&
                          abs(dv) < Vector::Norm(Dy)) ? exp(-10.0*dU.z*dU.z) : 0.0;
         }
      }
   }
}